

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O2

StatsByIP * __thiscall StatsByIP::CreateCopy(StatsByIP *this)

{
  ulong uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  StatsByIP *pSVar5;
  size_t __n;
  
  pSVar5 = (StatsByIP *)operator_new(0x58);
  uVar1 = this->addr_len;
  pSVar5->_vptr_StatsByIP = (_func_int **)&PTR__StatsByIP_001b4580;
  pSVar5->HashNext = (StatsByIP *)0x0;
  pSVar5->count = 1;
  __n = 0x10;
  if (uVar1 < 0x10) {
    __n = uVar1;
  }
  memcpy(pSVar5->addr,this->addr,__n);
  pSVar5->addr_len = __n;
  uVar2 = this->nb_do;
  uVar3 = this->nb_edns;
  uVar4 = this->nb_not_qname_mini;
  pSVar5->hash = this->hash;
  pSVar5->nb_do = uVar2;
  pSVar5->nb_edns = uVar3;
  pSVar5->nb_not_qname_mini = uVar4;
  uVar2 = this->nb_tcp_443;
  pSVar5->nb_recursive_queries = this->nb_recursive_queries;
  pSVar5->nb_tcp_443 = uVar2;
  pSVar5->nb_tcp_583 = this->nb_tcp_583;
  pSVar5->query_seen = this->query_seen;
  pSVar5->response_seen = this->response_seen;
  pSVar5->option_mask = this->option_mask;
  return pSVar5;
}

Assistant:

StatsByIP * StatsByIP::CreateCopy()
{
    StatsByIP * x = new StatsByIP(addr, addr_len, false, false, false, false);

    if (x != NULL)
    {
        x->hash = hash;
        x->nb_do = nb_do;
        x->nb_edns = nb_edns;
        x->nb_not_qname_mini = nb_not_qname_mini;
        x->nb_recursive_queries = nb_recursive_queries;
        x->nb_tcp_443 = nb_tcp_443;
        x->nb_tcp_583 = nb_tcp_583;
        x->query_seen = query_seen;
        x->response_seen = response_seen;
        x->option_mask = option_mask;
    }

    return x;
}